

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O1

void __thiscall GetUniquePathTest_MPICH_Test::TestBody(GetUniquePathTest_MPICH_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar1;
  size_type *psVar2;
  size_type *psVar3;
  char *pcVar4;
  undefined1 local_158 [8];
  WithEnv rank;
  WithEnv withTestVar;
  char *expectedParent;
  string expectedChild;
  WithEnv withForced;
  AssertionResult gtest_ar_2;
  AssertHelper local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  
  psVar3 = &withTestVar.var._M_string_length;
  rank.val.field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&rank.val.field_2 + 8),"PMI_RANK","");
  psVar2 = &withForced.var._M_string_length;
  expectedChild.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedChild.field_2 + 8),"5","");
  WithEnv::WithEnv((WithEnv *)local_158,(string *)((long)&rank.val.field_2 + 8),
                   (string *)((long)&expectedChild.field_2 + 8));
  if ((size_type *)expectedChild.field_2._8_8_ != psVar2) {
    operator_delete((void *)expectedChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if ((size_type *)rank.val.field_2._8_8_ != psVar3) {
    operator_delete((void *)rank.val.field_2._8_8_,withTestVar.var._M_string_length + 1);
  }
  expectedChild.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedChild.field_2 + 8),"GPROF_TEST_PATH","");
  psVar3 = &expectedChild._M_string_length;
  expectedParent = (char *)psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&expectedParent,"/var/log/some_file_name","");
  WithEnv::WithEnv((WithEnv *)((long)&rank.val.field_2 + 8),
                   (string *)((long)&expectedChild.field_2 + 8),(string *)&expectedParent);
  if ((size_type *)expectedParent != psVar3) {
    operator_delete(expectedParent,expectedChild._M_string_length + 1);
  }
  if ((size_type *)expectedChild.field_2._8_8_ != psVar2) {
    operator_delete((void *)expectedChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  withTestVar.val.field_2._8_8_ = anon_var_dwarf_51ff;
  expectedChild.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&expectedChild.field_2 + 8),"/var/log/some_file_name.rank-5","");
  AppendPID((string *)&expectedParent,(string *)((long)&expectedChild.field_2 + 8));
  if ((size_type *)expectedChild.field_2._8_8_ != psVar2) {
    operator_delete((void *)expectedChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)local_48,"expectedParent","GetTestPath()",
             (char **)((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedChild.field_2 + 8));
  if ((size_type *)expectedChild.field_2._8_8_ != psVar2) {
    operator_delete((void *)expectedChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&expectedChild.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,199,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedChild.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedChild.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedChild.field_2._8_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_48,"expectedChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expectedParent,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedChild.field_2 + 8));
  if ((size_type *)expectedChild.field_2._8_8_ != psVar2) {
    operator_delete((void *)expectedChild.field_2._8_8_,withForced.var._M_string_length + 1);
  }
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)((long)&expectedChild.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xca,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedChild.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedChild.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedChild.field_2._8_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  setenv((char *)rank.val.field_2._8_8_,(char *)withTestVar.var.field_2._8_8_,1);
  puVar1 = &gtest_ar.message_;
  local_48 = (undefined1  [8])puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"GPROF_TEST_PATH_USE_PID","");
  withForced.val.field_2._8_8_ = &gtest_ar_2.message_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&withForced.val.field_2 + 8),"1","");
  WithEnv::WithEnv((WithEnv *)((long)&expectedChild.field_2 + 8),(string *)local_48,
                   (string *)((long)&withForced.val.field_2 + 8));
  if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)withForced.val.field_2._8_8_ != &gtest_ar_2.message_) {
    operator_delete((void *)withForced.val.field_2._8_8_,
                    (long)gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (local_48 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_48,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expectedParent,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  if (local_48 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_48,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_48);
    if (gtest_ar_2._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xd0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)((long)*(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                           *)local_48 + 8))();
    }
  }
  if (gtest_ar_2._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_2._0_8_);
  }
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expectedParent,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  if (local_48 != (undefined1  [8])puVar1) {
    operator_delete((void *)local_48,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_48);
    if (gtest_ar_2._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xd3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)((long)*(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                           *)local_48 + 8))();
    }
  }
  if (gtest_ar_2._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_2._0_8_);
  }
  WithEnv::~WithEnv((WithEnv *)((long)&expectedChild.field_2 + 8));
  if ((size_type *)expectedParent != psVar3) {
    operator_delete(expectedParent,expectedChild._M_string_length + 1);
  }
  WithEnv::~WithEnv((WithEnv *)((long)&rank.val.field_2 + 8));
  WithEnv::~WithEnv((WithEnv *)local_158);
  return;
}

Assistant:

TEST(GetUniquePathTest, MPICH) {
  WithEnv rank("PMI_RANK", "5");
  WithEnv withTestVar(TEST_VAR, TEST_VAL);

  const auto expectedParent = TEST_VAL ".rank-5";
  const auto expectedChild = AppendPID(expectedParent);

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedParent, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedChild, GetTestPath());

  withTestVar.Reset();
  WithEnv withForced(TEST_VAR "_USE_PID", "1");

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedChild, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedChild, GetTestPath());
}